

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial.c
# Opt level: O1

void partial_bndry(int type,Item *qvar,Item *qfirstlast,Item *qexpr,Item *qlast)

{
  Item *pIVar1;
  List *s;
  int iVar2;
  
  if (bndinfo == (List *)0x0) {
    bndinfo = newlist();
  }
  iVar2 = (uint)(((qfirstlast->element).itm)->itemtype != 0x14b) + type;
  lappendsym(bndinfo,(qvar->element).sym);
  pIVar1 = lappendsym(bndinfo,(Symbol *)0x0);
  pIVar1->itemtype = (short)iVar2;
  s = newlist();
  (pIVar1->element).lst = s;
  pIVar1 = qvar->prev;
  if (iVar2 < 2) {
    pIVar1 = pIVar1->prev;
  }
  deltokens(pIVar1,qexpr->prev);
  movelist(qexpr,qlast,s);
  return;
}

Assistant:

void partial_bndry(type, qvar, qfirstlast, qexpr, qlast)
	int type;
	Item *qvar, *qfirstlast, *qexpr, *qlast;
{
	int indx;
	Item *q;
	List *l;
	
	if (!bndinfo) {
		bndinfo = newlist();
	}
	if (SYM(qfirstlast)->type == FIRST) {
		indx = type;
	}else{
		indx = type + 1;
	}
	Lappendsym(bndinfo, SYM(qvar));
	q = lappendsym(bndinfo, SYM0);
	q->itemtype = indx;
	l = newlist();
	LST(q) = l;

	if (indx < 2) { /* ~ DEL y [N] = */
		deltokens(qvar->prev->prev, qexpr->prev);
	}else{ /* ~ ... = */
		deltokens(qvar->prev, qexpr->prev);
	}
	movelist(qexpr, qlast, l);
}